

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O1

char * getActionName(efsw_action action)

{
  if (action - EFSW_ADD < 4) {
    return (&PTR_anon_var_dwarf_68_0011ea10)[action - EFSW_ADD];
  }
  return "Bad Action";
}

Assistant:

const char * getActionName( enum efsw_action action ) {
	switch ( action ) {
		case EFSW_ADD:
			return "Add";
		case EFSW_MODIFIED:
			return "Modified";
		case EFSW_DELETE:
			return "Delete";
		case EFSW_MOVED:
			return "Moved";
		default:
			return "Bad Action";
	}
}